

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_inflator.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::ZLIBBufferInflator::InitializeStream(ZLIBBufferInflator *this)

{
  int iVar1;
  ostream *poVar2;
  CompressorException *this_00;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  (this->stream_).avail_in = 0;
  (this->stream_).next_in = (Bytef *)0x0;
  (this->stream_).zalloc = (alloc_func)0x0;
  (this->stream_).zfree = (free_func)0x0;
  (this->stream_).opaque = (voidpf)0x0;
  iVar1 = inflateInit2_(&this->stream_,0xfffffff1,"1.2.11",0x70);
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"problem occurred while initializing stream: ZLIB_ERROR_CODE(",0x3c);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  this_00 = (CompressorException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  exceptions::CompressorException::CompressorException(this_00,&local_1c0);
  __cxa_throw(this_00,&exceptions::CompressorException::typeinfo,
              exceptions::BidFXException::~BidFXException);
}

Assistant:

void ZLIBBufferInflator::InitializeStream()
{
    /* allocate inflate state */
    stream_.zalloc = Z_NULL;
    stream_.zfree = Z_NULL;
    stream_.opaque = Z_NULL;
    stream_.avail_in = 0;
    stream_.next_in = Z_NULL;
    int ret = inflateInit2(&stream_, -MAX_WBITS);
    if (ret != Z_OK)
    {
        std::stringstream ss;
        ss << "problem occurred while initializing stream: ZLIB_ERROR_CODE(" << ret << ")";
        throw CompressorException(ss.str());
    }
}